

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_color_hex_rgb(char *output,nk_color col)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  char cVar4;
  
  uVar3 = (uint)col >> 4 & 0xf;
  cVar1 = (char)uVar3;
  cVar4 = cVar1 + '7';
  if (uVar3 < 10) {
    cVar4 = cVar1 + '0';
  }
  *output = cVar4;
  cVar1 = (char)((uint)col & 0xf);
  cVar4 = cVar1 + '7';
  if (((uint)col & 0xf) < 10) {
    cVar4 = cVar1 + '0';
  }
  output[1] = cVar4;
  uVar3 = (uint)col >> 0xc & 0xf;
  cVar1 = (char)uVar3;
  cVar4 = cVar1 + '7';
  if (uVar3 < 10) {
    cVar4 = cVar1 + '0';
  }
  output[2] = cVar4;
  uVar3 = (uint)col >> 8 & 0xf;
  cVar1 = (char)uVar3;
  cVar4 = cVar1 + '7';
  if (uVar3 < 10) {
    cVar4 = cVar1 + '0';
  }
  uVar3 = (uint)col >> 0x14 & 0xf;
  cVar1 = (char)uVar3;
  cVar2 = cVar1 + '7';
  if (uVar3 < 10) {
    cVar2 = cVar1 + '0';
  }
  output[3] = cVar4;
  output[4] = cVar2;
  uVar3 = (uint)col >> 0x10 & 0xf;
  cVar1 = (char)uVar3;
  cVar4 = cVar1 + '7';
  if (uVar3 < 10) {
    cVar4 = cVar1 + '0';
  }
  output[5] = cVar4;
  output[6] = '\0';
  return;
}

Assistant:

NK_API void
nk_color_hex_rgb(char *output, struct nk_color col)
{
    #define NK_TO_HEX(i) ((i) <= 9 ? '0' + (i): 'A' - 10 + (i))
    output[0] = (char)NK_TO_HEX((col.r & 0xF0) >> 4);
    output[1] = (char)NK_TO_HEX((col.r & 0x0F));
    output[2] = (char)NK_TO_HEX((col.g & 0xF0) >> 4);
    output[3] = (char)NK_TO_HEX((col.g & 0x0F));
    output[4] = (char)NK_TO_HEX((col.b & 0xF0) >> 4);
    output[5] = (char)NK_TO_HEX((col.b & 0x0F));
    output[6] = '\0';
    #undef NK_TO_HEX
}